

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O3

void printUsage(char *executable)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  if (executable == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1270c0);
  }
  else {
    sVar1 = strlen(executable);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,executable,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [OPTIONS]",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Supported options:",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  --softAes         use software AES (default: x86 AES-NI)",0x3a
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  --nonce  N        seed nonce (default: 1000)",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  --genAsm          generate x86-64 asm code for nonce N",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  --genNative       generate DefyX code for nonce N",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  --genSuperscalar  generate superscalar program for nonce N",
             0x3c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void printUsage(const char* executable) {
	std::cout << "Usage: " << executable << " [OPTIONS]" << std::endl;
	std::cout << "Supported options:" << std::endl;
	std::cout << "  --softAes         use software AES (default: x86 AES-NI)" << std::endl;
	std::cout << "  --nonce  N        seed nonce (default: 1000)" << std::endl;
	std::cout << "  --genAsm          generate x86-64 asm code for nonce N" << std::endl;
	std::cout << "  --genNative       generate DefyX code for nonce N" << std::endl;
	std::cout << "  --genSuperscalar  generate superscalar program for nonce N" << std::endl;
}